

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

exr_result_t
exr_start_write(exr_context_t *ctxt,char *filename,exr_default_write_mode_t default_mode,
               exr_context_initializer_t *ctxtdata)

{
  size_t sVar1;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *p_Var2;
  exr_context_t p_Var3;
  exr_result_t eVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  size_t __n;
  char *pcVar8;
  int *piVar9;
  char *pcVar10;
  size_t __n_00;
  char *pcVar11;
  ulong uVar12;
  exr_context_t ret;
  exr_context_initializer_t inits;
  exr_context_t local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  exr_context_initializer_t local_c0;
  char local_58 [40];
  
  local_e0 = (exr_context_t)0x0;
  local_c0.flags = 0;
  local_c0.pad[0] = '\0';
  local_c0.pad[1] = '\0';
  local_c0.pad[2] = '\0';
  local_c0.pad[3] = '\0';
  local_c0.max_image_width = 0;
  local_c0.max_image_height = 0;
  local_c0.max_tile_width = 0;
  local_c0.max_tile_height = 0;
  local_c0.write_fn = (exr_write_func_ptr_t)0x0;
  local_c0.destroy_fn = (exr_destroy_stream_func_ptr_t)0x0;
  local_c0.read_fn = (exr_read_func_ptr_t)0x0;
  local_c0.size_fn = (exr_query_size_func_ptr_t)0x0;
  local_c0.free_fn = (exr_memory_free_func_t)0x0;
  local_c0.user_data = (void *)0x0;
  local_c0.error_handler_fn = (exr_error_handler_cb_t)0x0;
  local_c0.alloc_fn = (exr_memory_allocation_func_t)0x0;
  local_c0.size = 0x68;
  local_c0.zip_level = -2;
  local_c0.dwa_quality = -1.0;
  if (ctxtdata != (exr_context_initializer_t *)0x0) {
    local_c0.error_handler_fn = ctxtdata->error_handler_fn;
    local_c0.alloc_fn = ctxtdata->alloc_fn;
    local_c0.free_fn = ctxtdata->free_fn;
    local_c0.user_data = ctxtdata->user_data;
    local_c0.read_fn = ctxtdata->read_fn;
    local_c0.size_fn = ctxtdata->size_fn;
    local_c0.write_fn = ctxtdata->write_fn;
    local_c0.destroy_fn = ctxtdata->destroy_fn;
    local_c0.max_image_width = ctxtdata->max_image_width;
    local_c0.max_image_height = ctxtdata->max_image_height;
    local_c0.max_tile_width = ctxtdata->max_tile_width;
    local_c0.max_tile_height = ctxtdata->max_tile_height;
    if ((0x5f < ctxtdata->size) &&
       (local_c0.zip_level = ctxtdata->zip_level, local_c0.dwa_quality = ctxtdata->dwa_quality,
       0x67 < ctxtdata->size)) {
      local_c0.pad[0] = '\0';
      local_c0.pad[1] = '\0';
      local_c0.pad[2] = '\0';
      local_c0.pad[3] = '\0';
      local_c0.flags = ctxtdata->flags;
    }
  }
  internal_exr_update_default_handlers(&local_c0);
  if (ctxt == (exr_context_t *)0x0) {
    (*local_c0.error_handler_fn)
              ((exr_const_context_t)0x0,3,"Invalid context handle passed to start_read function");
    return 3;
  }
  if (filename == (char *)0x0) {
    iVar5 = 3;
    (*local_c0.error_handler_fn)
              ((exr_const_context_t)0x0,3,"Invalid filename passed to start_write function");
    goto LAB_001188e2;
  }
  iVar5 = 1;
  eVar4 = internal_exr_alloc_context(&local_e0,&local_c0,EXR_CONTEXT_WRITE,4);
  if (eVar4 != 0) goto LAB_001188e2;
  local_e0->do_write = dispatch_write;
  iVar5 = exr_attr_string_create(local_e0,&local_e0->filename,filename);
  p_Var3 = local_e0;
  if ((iVar5 == 0) && (local_c0.write_fn == (exr_write_func_ptr_t)0x0)) {
    if (default_mode != EXR_INTERMEDIATE_TEMP_FILE) {
LAB_0011884f:
      p_Var3 = local_e0;
      pcVar10 = (local_e0->tmp_filename).str;
      piVar9 = (int *)local_e0->user_data;
      if (pcVar10 == (char *)0x0) {
        pcVar10 = (local_e0->filename).str;
      }
      *piVar9 = -1;
      local_e0->destroy_fn = default_shutdown;
      local_e0->write_fn = default_write_func;
      iVar5 = 0;
      iVar7 = open(pcVar10,0x80241,0x1b6);
      if (-1 < iVar7) {
        *piVar9 = iVar7;
        goto LAB_001188e2;
      }
      p_Var2 = p_Var3->print_error;
      piVar9 = __errno_location();
      pcVar10 = strerror(*piVar9);
      iVar5 = (*p_Var2)(p_Var3,5,"Unable to open file for write: %s",pcVar10);
      goto LAB_001188d0;
    }
    pcVar10 = (local_e0->filename).str;
    uVar6 = getpid();
    iVar5 = snprintf(local_58,0x20,"tmp.%d",(ulong)uVar6);
    if (iVar5 < 0x20) {
      __n = strlen(local_58);
      uVar12 = (long)(p_Var3->filename).length + __n;
      if (uVar12 < 0x7fffffff) {
        sVar1 = uVar12 + 1;
        local_d8 = (char *)(*p_Var3->alloc_fn)(sVar1);
        if (local_d8 != (char *)0x0) {
          pcVar8 = strrchr(pcVar10,0x2f);
          pcVar11 = local_d8;
          (p_Var3->tmp_filename).length = (int32_t)uVar12;
          (p_Var3->tmp_filename).alloc_size = (int32_t)sVar1;
          (p_Var3->tmp_filename).str = local_d8;
          if (pcVar8 == (char *)0x0) {
            memcpy(local_d8,local_58,__n);
            __n_00 = (size_t)(p_Var3->filename).length;
            pcVar8 = pcVar11;
          }
          else {
            local_c8 = pcVar8 + (1 - (long)pcVar10);
            memcpy(local_d8,pcVar10,(size_t)local_c8);
            pcVar11 = local_d8;
            local_d0 = local_d8 + (long)(pcVar8 + (1 - (long)pcVar10));
            memcpy(local_d0,local_58,__n);
            pcVar10 = pcVar8 + 1;
            __n_00 = (long)(p_Var3->filename).length - (long)local_c8;
            pcVar8 = local_d0;
          }
          memcpy(pcVar8 + __n,pcVar10,__n_00);
          pcVar11[uVar12] = '\0';
          goto LAB_0011884f;
        }
        iVar5 = (*p_Var3->print_error)
                          (p_Var3,1,"Unable to create %lu bytes for temporary filename",sVar1);
      }
      else {
        iVar5 = (*p_Var3->standard_error)(p_Var3,1);
      }
    }
    else {
      iVar5 = (*p_Var3->report_error)(p_Var3,3,"Invalid assumption in temporary filename");
    }
    if (iVar5 == 0) goto LAB_0011884f;
  }
  else {
LAB_001188d0:
    if (iVar5 == 0) {
      iVar5 = 0;
      goto LAB_001188e2;
    }
  }
  exr_finish(&local_e0);
LAB_001188e2:
  *ctxt = local_e0;
  return iVar5;
}

Assistant:

exr_result_t
exr_start_write (
    exr_context_t*                   ctxt,
    const char*                      filename,
    exr_default_write_mode_t         default_mode,
    const exr_context_initializer_t* ctxtdata)
{
    int                       rv    = EXR_ERR_UNKNOWN;
    exr_context_t             ret   = NULL;
    exr_context_initializer_t inits = fill_context_data (ctxtdata);

    if (!ctxt)
    {
        inits.error_handler_fn (
            NULL,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid context handle passed to start_read function");
        return EXR_ERR_INVALID_ARGUMENT;
    }

    if (filename)
    {
        rv = internal_exr_alloc_context (
            &ret,
            &inits,
            EXR_CONTEXT_WRITE,
            sizeof (struct _internal_exr_filehandle));
        if (rv == EXR_ERR_SUCCESS)
        {
            ret->do_write = &dispatch_write;

            rv = exr_attr_string_create (
                (exr_context_t) ret, &(ret->filename), filename);

            if (rv == EXR_ERR_SUCCESS)
            {
                if (!inits.write_fn)
                {
                    if (default_mode == EXR_INTERMEDIATE_TEMP_FILE)
                        rv = make_temp_filename (ret);
                    if (rv == EXR_ERR_SUCCESS)
                        rv = default_init_write_file (ret);
                }
            }

            if (rv != EXR_ERR_SUCCESS) exr_finish ((exr_context_t*) &ret);
        }
        else
            rv = EXR_ERR_OUT_OF_MEMORY;
    }
    else
    {
        inits.error_handler_fn (
            NULL,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid filename passed to start_write function");
        rv = EXR_ERR_INVALID_ARGUMENT;
    }

    *ctxt = (exr_context_t) ret;
    return rv;
}